

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O1

pair<std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
* findFiles_abi_cxx11_(void)

{
  int iVar1;
  int iVar2;
  path *__args;
  pair<std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
  *in_RDI;
  vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>> *this;
  bool bVar3;
  undefined1 auVar4 [16];
  path local_1e0;
  path local_1b8;
  path local_190;
  path local_168;
  recursive_directory_iterator local_140;
  recursive_directory_iterator local_130;
  pair<std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
  *local_120;
  undefined1 auStack_118 [8];
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  sourcePaths;
  undefined1 auStack_f8 [8];
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  headerPaths;
  undefined1 auStack_d8 [8];
  recursive_directory_iterator __end1;
  path local_c0;
  undefined1 auStack_98 [8];
  recursive_directory_iterator __begin1;
  element_type *local_80;
  string_type local_78;
  path local_58;
  
  sourcePaths.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_118 = (undefined1  [8])0x0;
  sourcePaths.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  headerPaths.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_f8 = (undefined1  [8])0x0;
  headerPaths.
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::filesystem::current_path_abi_cxx11_();
  std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            ((recursive_directory_iterator *)&__begin1._M_dirs._M_refcount,&local_c0,none,
             (error_code *)0x0);
  std::filesystem::__cxx11::path::~path(&local_c0);
  if (local_80 != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_80 + 8) = *(int *)(local_80 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_80 + 8) = *(int *)(local_80 + 8) + 1;
    }
  }
  auStack_98 = (undefined1  [8])__begin1._M_dirs._M_refcount._M_pi;
  __begin1._M_dirs._M_ptr = local_80;
  local_140._M_dirs._M_ptr = (element_type *)0x0;
  local_140._M_dirs._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&local_140);
  local_130._M_dirs._M_ptr = (element_type *)__begin1._M_dirs._M_refcount._M_pi;
  if (local_80 != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_80 + 8) = *(int *)(local_80 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_80 + 8) = *(int *)(local_80 + 8) + 1;
    }
  }
  auStack_d8 = (undefined1  [8])0x0;
  __end1._M_dirs._M_ptr = (element_type *)0x0;
  local_120 = in_RDI;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&local_130);
  do {
    if (__begin1._M_dirs._M_ptr == __end1._M_dirs._M_ptr) {
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                ((recursive_directory_iterator *)auStack_d8);
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                ((recursive_directory_iterator *)auStack_98);
      std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator
                ((recursive_directory_iterator *)&__begin1._M_dirs._M_refcount);
      std::
      pair<std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_>
      ::
      pair<std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_&,_std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>_&,_true>
                (local_120,
                 (vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                  *)auStack_118,
                 (vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
                  *)auStack_f8);
      std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
      ~vector((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
               *)auStack_f8);
      std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
      ~vector((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
               *)auStack_118);
      return local_120;
    }
    __args = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*
                               ((recursive_directory_iterator *)auStack_98);
    auVar4 = std::filesystem::__cxx11::path::_M_find_extension();
    if (auVar4._8_8_ == -1 || auVar4._0_8_ == 0) {
      std::filesystem::__cxx11::path::path(&local_c0);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_58,auVar4._0_8_);
      std::filesystem::__cxx11::path::path(&local_c0,&local_58._M_pathname,auto_format);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_pathname._M_dataplus._M_p != &local_58._M_pathname.field_2) {
        operator_delete(local_58._M_pathname._M_dataplus._M_p,
                        local_58._M_pathname.field_2._M_allocated_capacity + 1);
      }
    }
    std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
              (&local_58,(char (*) [5])0x10a08b,auto_format);
    iVar1 = std::filesystem::__cxx11::path::compare(&local_c0);
    if (iVar1 == 0) {
      bVar3 = true;
    }
    else {
      auVar4 = std::filesystem::__cxx11::path::_M_find_extension();
      if (auVar4._8_8_ == -1 || auVar4._0_8_ == 0) {
        std::filesystem::__cxx11::path::path(&local_190);
      }
      else {
        std::__cxx11::string::substr((ulong)&local_78,auVar4._0_8_);
        std::filesystem::__cxx11::path::path(&local_190,&local_78,auto_format);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
      }
      std::filesystem::__cxx11::path::path<char[3],std::filesystem::__cxx11::path>
                (&local_1e0,(char (*) [3])".c",auto_format);
      iVar2 = std::filesystem::__cxx11::path::compare(&local_190);
      bVar3 = iVar2 == 0;
    }
    if (iVar1 != 0) {
      std::filesystem::__cxx11::path::~path(&local_1e0);
      std::filesystem::__cxx11::path::~path(&local_190);
    }
    std::filesystem::__cxx11::path::~path(&local_58);
    std::filesystem::__cxx11::path::~path(&local_c0);
    this = (vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>> *)
           auStack_118;
    if (bVar3) {
LAB_00108108:
      std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>::
      emplace_back<std::filesystem::__cxx11::path_const&>(this,__args);
    }
    else {
      auVar4 = std::filesystem::__cxx11::path::_M_find_extension();
      if (auVar4._8_8_ == -1 || auVar4._0_8_ == 0) {
        std::filesystem::__cxx11::path::path(&local_c0);
      }
      else {
        std::__cxx11::string::substr((ulong)&local_58,auVar4._0_8_);
        std::filesystem::__cxx11::path::path(&local_c0,&local_58._M_pathname,auto_format);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_pathname._M_dataplus._M_p != &local_58._M_pathname.field_2) {
          operator_delete(local_58._M_pathname._M_dataplus._M_p,
                          local_58._M_pathname.field_2._M_allocated_capacity + 1);
        }
      }
      std::filesystem::__cxx11::path::path<char[3],std::filesystem::__cxx11::path>
                (&local_58,(char (*) [3])".h",auto_format);
      iVar1 = std::filesystem::__cxx11::path::compare(&local_c0);
      if (iVar1 == 0) {
        bVar3 = true;
      }
      else {
        auVar4 = std::filesystem::__cxx11::path::_M_find_extension();
        if (auVar4._8_8_ == -1 || auVar4._0_8_ == 0) {
          std::filesystem::__cxx11::path::path(&local_168);
        }
        else {
          std::__cxx11::string::substr((ulong)&local_78,auVar4._0_8_);
          std::filesystem::__cxx11::path::path(&local_168,&local_78,auto_format);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
        }
        std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
                  (&local_1b8,(char (*) [5])".hpp",auto_format);
        iVar2 = std::filesystem::__cxx11::path::compare(&local_168);
        bVar3 = iVar2 == 0;
      }
      if (iVar1 != 0) {
        std::filesystem::__cxx11::path::~path(&local_1b8);
        std::filesystem::__cxx11::path::~path(&local_168);
      }
      std::filesystem::__cxx11::path::~path(&local_58);
      std::filesystem::__cxx11::path::~path(&local_c0);
      this = (vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
              *)auStack_f8;
      if (bVar3) goto LAB_00108108;
    }
    std::filesystem::__cxx11::recursive_directory_iterator::operator++
              ((recursive_directory_iterator *)auStack_98);
  } while( true );
}

Assistant:

std::pair< std::vector<fs::path>, std::vector<fs::path>> findFiles()
{
    std::vector<fs::path> sourcePaths;
    std::vector<fs::path> headerPaths;
    for (auto& entry : fs::recursive_directory_iterator(fs::current_path())) {
        const auto& path = entry.path();
        if (path.extension() == ".cpp" || path.extension() == ".c") {
            sourcePaths.emplace_back(path);
        }
        else if (path.extension() == ".h" || path.extension() == ".hpp") {
            headerPaths.emplace_back(path);
        }
    }
    return { sourcePaths, headerPaths };
}